

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloth_decorator.h
# Opt level: O1

void __thiscall
decorator::ClothDecorator::ClothDecorator(ClothDecorator *this,shared_ptr<decorator::Human> *human)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  peVar1 = (human->super___shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (human->super___shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->super_WomenDecorator).super_Human._vptr_Human = (_func_int **)&PTR_Outlook_00129880;
    (this->super_WomenDecorator).human_.
    super___shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (this->super_WomenDecorator).human_.
    super___shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    (this->super_WomenDecorator).super_Human._vptr_Human = (_func_int **)&PTR_Outlook_00129880;
    (this->super_WomenDecorator).human_.
    super___shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (this->super_WomenDecorator).human_.
    super___shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0011ad7a;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_0011ad7a:
  (this->super_WomenDecorator).super_Human._vptr_Human = (_func_int **)&PTR_Outlook_00129898;
  return;
}

Assistant:

ClothDecorator::ClothDecorator(std::shared_ptr<Human> human)
        : WomenDecorator(human) {}